

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

char * IoTHubClientCore_LL_GetProductInfo(void *ctx)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *iothub_data;
  LOGGER_LOG l;
  char *result;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_GetProductInfo",0x280,1,"invalid argument ctx %p",0);
    }
  }
  else {
    l = (LOGGER_LOG)STRING_c_str(*(STRING_HANDLE *)((long)ctx + 0x1b0));
  }
  return (char *)l;
}

Assistant:

static const char* IoTHubClientCore_LL_GetProductInfo(void* ctx)
{
    const char* result;
    if (ctx == NULL)
    {
        result = NULL;
        LogError("invalid argument ctx %p", ctx);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* iothub_data = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        result = STRING_c_str(iothub_data->product_info);
    }
    return result;
}